

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,EvalMapStringInternal<false> *key,ScriptFunction **value)

{
  BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  char *pcVar2;
  undefined8 *puVar3;
  ScriptFunction *pSVar4;
  char16_t *pcVar5;
  long lVar6;
  code *pcVar7;
  undefined8 uVar8;
  EvalMapStringInternal<false> *pEVar9;
  bool bVar10;
  int iVar11;
  undefined4 *puVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  char *addr;
  ScriptFunction *local_78;
  hash_t *local_70;
  long local_68;
  long local_60;
  EvalMapStringInternal<false> *local_58;
  long local_50;
  ScriptFunction *local_48;
  hash_t local_3c;
  BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *local_38;
  
  lVar15 = *(long *)this;
  local_38 = (BaseDictionary<Js::EvalMapStringInternal<false>,Js::ScriptFunction*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)value;
  if (lVar15 == 0) {
    BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar15 = *(long *)this;
  }
  uVar13 = key->hash >> 1;
  local_50 = CONCAT44(local_50._4_4_,uVar13);
  local_58 = key;
  local_3c = PrimePolicy::ModPrime(uVar13,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar13 = *(uint *)(lVar15 + (ulong)local_3c * 4);
  if ((int)uVar13 < 0) {
    uVar14 = 0;
  }
  else {
    lVar15 = *(long *)(this + 8);
    uVar14 = 0;
    do {
      pcVar2 = (char *)(lVar15 + (ulong)uVar13 * 0x38);
      bVar10 = Js::EvalMapStringInternal<false>::operator==
                         ((EvalMapStringInternal<false> *)(lVar15 + (ulong)uVar13 * 0x38 + 0x10),
                          local_58);
      if (bVar10) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar14);
        }
        pSVar4 = *(ScriptFunction **)local_38;
        Memory::Recycler::WBSetBit((char *)&local_78);
        local_78 = pSVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_78);
        pSVar4 = local_78;
        Memory::Recycler::WBSetBit(pcVar2);
        *(ScriptFunction **)pcVar2 = pSVar4;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
        return uVar13;
      }
      uVar14 = uVar14 + 1;
      uVar13 = *(uint *)(pcVar2 + 8);
    } while (-1 < (int)uVar13);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar14);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar11 = *(int *)(this + 0x18);
    iVar16 = *(int *)(this + 0x20);
    if (iVar16 == iVar11) {
      BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_3c = PrimePolicy::ModPrime
                           ((hash_t)local_50,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar11 = *(int *)(this + 0x18);
      iVar16 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar16 + 1;
    if (iVar11 < iVar16 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f1,"(count <= size)","count <= size");
      if (!bVar10) goto LAB_0079a848;
      *puVar12 = 0;
      iVar11 = *(int *)(this + 0x18);
    }
    if (iVar11 <= iVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3f2,"(index < size)","index < size");
      if (!bVar10) goto LAB_0079a848;
      *puVar12 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar10) goto LAB_0079a848;
      *puVar12 = 0;
    }
    iVar16 = *(int *)(this + 0x24);
    if (iVar16 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar10) goto LAB_0079a848;
      *puVar12 = 0;
      iVar16 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                          ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar10) {
LAB_0079a848:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar12 = 0;
      iVar16 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar11 = BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetNextFreeEntryIndex((EntryType *)((long)iVar16 * 0x38 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar11;
    }
  }
  pEVar9 = local_58;
  local_70 = &local_58->hash;
  local_60 = *(long *)(this + 8);
  local_50 = (long)iVar16;
  lVar15 = local_50 * 0x38;
  pcVar2 = (char *)(local_60 + lVar15);
  local_48 = *(ScriptFunction **)local_38;
  local_68 = lVar15;
  local_38 = this;
  Memory::Recycler::WBSetBit((char *)&local_78);
  local_78 = local_48;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_78);
  local_48 = local_78;
  Memory::Recycler::WBSetBit(pcVar2);
  pBVar1 = local_38;
  puVar3 = (undefined8 *)(local_60 + lVar15);
  addr = (char *)(puVar3 + 3);
  *puVar3 = local_48;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
  puVar3[2] = pEVar9->owningVar;
  pcVar5 = (pEVar9->str).string.ptr;
  Memory::Recycler::WBSetBit(addr);
  *(char16_t **)addr = pcVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  *(Type *)(puVar3 + 4) = (pEVar9->str).len;
  uVar8 = *(undefined8 *)(local_70 + 2);
  puVar3[5] = *(undefined8 *)local_70;
  puVar3[6] = uVar8;
  lVar15 = *(long *)pBVar1;
  lVar6 = *(long *)(pBVar1 + 8);
  *(undefined4 *)(lVar6 + 8 + local_68) = *(undefined4 *)(lVar15 + (ulong)local_3c * 4);
  *(int *)(lVar15 + (ulong)local_3c * 4) = (int)local_50;
  uVar14 = 0;
  iVar11 = iVar16;
  do {
    iVar11 = *(int *)(lVar6 + 8 + (long)iVar11 * 0x38);
    uVar14 = uVar14 + 1;
  } while (iVar11 != -1);
  if (*(DictionaryStats **)(pBVar1 + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(pBVar1 + 0x30),uVar14);
  }
  return iVar16;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }